

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::~RBBITableBuilder(RBBITableBuilder *this)

{
  UVector *this_00;
  RBBIStateDescriptor *this_01;
  uint index;
  void *p;
  
  for (index = 0; this_00 = this->fDStates, (int)index < this_00->count; index = index + 1) {
    p = (void *)(ulong)index;
    this_01 = (RBBIStateDescriptor *)UVector::elementAt(this_00,index);
    if (this_01 != (RBBIStateDescriptor *)0x0) {
      RBBIStateDescriptor::~RBBIStateDescriptor(this_01);
    }
    UMemory::operator_delete((UMemory *)this_01,p);
  }
  (*(this_00->super_UObject)._vptr_UObject[1])();
  if (this->fSafeTable != (UVector *)0x0) {
    (*(this->fSafeTable->super_UObject)._vptr_UObject[1])();
    return;
  }
  return;
}

Assistant:

RBBITableBuilder::~RBBITableBuilder() {
    int i;
    for (i=0; i<fDStates->size(); i++) {
        delete (RBBIStateDescriptor *)fDStates->elementAt(i);
    }
    delete fDStates;
    delete fSafeTable;
}